

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::GenerateMergeFromCodedStreamWithPacking
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *file;
  long in_RDI;
  Formatter format;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  Formatter *in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  char *in_stack_ffffffffffffffb8;
  Formatter *in_stack_ffffffffffffffc0;
  
  Formatter::Formatter
            (in_stack_ffffffffffffff80,
             (Printer *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x5b2574);
  bVar1 = FieldDescriptor::is_packed
                    ((FieldDescriptor *)
                     CONCAT17(in_stack_ffffffffffffff8f,
                              CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
  if (bVar1) {
    Formatter::operator()<>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    bVar1 = HasPreservingUnknownEnumSemantics((FieldDescriptor *)0x5b2673);
    if (bVar1) {
      Formatter::operator()<>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else {
      Formatter::operator()<>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      file = FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
      bVar1 = UseUnknownFieldSet(file,(Options *)
                                      CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78))
      ;
      if (bVar1) {
        Formatter::operator()<>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      else {
        Formatter::operator()<>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      Formatter::operator()<>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    Formatter::operator()<>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    bVar1 = HasPreservingUnknownEnumSemantics((FieldDescriptor *)0x5b25a4);
    if (bVar1) {
      Formatter::operator()<>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else {
      FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
      bVar1 = UseUnknownFieldSet((FileDescriptor *)in_stack_ffffffffffffff80,
                                 (Options *)
                                 CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      if (bVar1) {
        Formatter::operator()<>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      else {
        Formatter::operator()<>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
    }
  }
  Formatter::~Formatter((Formatter *)0x5b2744);
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::GenerateMergeFromCodedStreamWithPacking(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (!descriptor_->is_packed()) {
    // This path is rarely executed, so we use a non-inlined implementation.
    if (HasPreservingUnknownEnumSemantics(descriptor_)) {
      format(
          "DO_((::$proto_ns$::internal::"
          "WireFormatLite::ReadPackedEnumPreserveUnknowns(\n"
          "       input,\n"
          "       $number$,\n"
          "       nullptr,\n"
          "       nullptr,\n"
          "       this->_internal_mutable_$name$())));\n");
    } else if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      format(
          "DO_((::$proto_ns$::internal::WireFormat::"
          "ReadPackedEnumPreserveUnknowns(\n"
          "       input,\n"
          "       $number$,\n"
          "       $type$_IsValid,\n"
          "       mutable_unknown_fields(),\n"
          "       this->_internal_mutable_$name$())));\n");
    } else {
      format(
          "DO_((::$proto_ns$::internal::"
          "WireFormatLite::ReadPackedEnumPreserveUnknowns(\n"
          "       input,\n"
          "       $number$,\n"
          "       $type$_IsValid,\n"
          "       &unknown_fields_stream,\n"
          "       this->_internal_mutable_$name$())));\n");
    }
  } else {
    format(
        "$uint32$ length;\n"
        "DO_(input->ReadVarint32(&length));\n"
        "::$proto_ns$::io::CodedInputStream::Limit limit = "
        "input->PushLimit(static_cast<int>(length));\n"
        "while (input->BytesUntilLimit() > 0) {\n"
        "  int value = 0;\n"
        "  DO_((::$proto_ns$::internal::WireFormatLite::ReadPrimitive<\n"
        "         int, ::$proto_ns$::internal::WireFormatLite::TYPE_ENUM>(\n"
        "       input, &value)));\n");
    if (HasPreservingUnknownEnumSemantics(descriptor_)) {
      format("  add_$name$(static_cast< $type$ >(value));\n");
    } else {
      format(
          "  if ($type$_IsValid(value)) {\n"
          "    _internal_add_$name$(static_cast< $type$ >(value));\n"
          "  } else {\n");
      if (UseUnknownFieldSet(descriptor_->file(), options_)) {
        format(
            "  mutable_unknown_fields()->AddVarint(\n"
            "      $number$, static_cast<$uint64$>(value));\n");
      } else {
        format(
            "    unknown_fields_stream.WriteVarint32(tag);\n"
            "    unknown_fields_stream.WriteVarint32(\n"
            "        static_cast<$uint32$>(value));\n");
      }
      format("  }\n");
    }
    format(
        "}\n"
        "input->PopLimit(limit);\n");
  }
}